

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall BotscriptParser::parseSwitchCase(BotscriptParser *this)

{
  int iVar1;
  bool bVar2;
  ScopeInfo *pSVar3;
  TokenInfo *pTVar4;
  long lVar5;
  reference pCVar6;
  DataBuffer *pDVar7;
  CaseInfo *info;
  Iterator __end1;
  Iterator __begin1;
  List<CaseInfo> *__range1;
  int num;
  bool isNegative;
  BotscriptParser *this_local;
  
  _num = this;
  pSVar3 = List<ScopeInfo>::operator[](&this->m_scopeStack,this->m_scopeCursor);
  if (pSVar3->type != SCOPE_Switch) {
    error<>("case label outside switch");
  }
  __range1._7_1_ = Lexer::next(this->m_lexer,Minus);
  Lexer::mustGetNext(this->m_lexer,Number);
  pTVar4 = Lexer::token(this->m_lexer);
  lVar5 = String::toLong(&pTVar4->text,(bool *)0x0,10);
  __range1._0_4_ = (int)lVar5;
  if ((__range1._7_1_ & 1) != 0) {
    __range1._0_4_ = -(int)__range1;
  }
  Lexer::mustGetNext(this->m_lexer,Colon);
  pSVar3 = List<ScopeInfo>::operator[](&this->m_scopeStack,this->m_scopeCursor);
  List<CaseInfo>::begin((Iterator *)&__end1._M_node,&pSVar3->cases);
  List<CaseInfo>::end((Iterator *)&info,&pSVar3->cases);
  while( true ) {
    bVar2 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&info);
    if (!bVar2) break;
    pCVar6 = std::_Deque_iterator<CaseInfo,_CaseInfo_&,_CaseInfo_*>::operator*
                       ((_Deque_iterator<CaseInfo,_CaseInfo_&,_CaseInfo_*> *)&__end1._M_node);
    if (pCVar6->number == (int)__range1) {
      error<int>("multiple case %1 labels in one switch",(int *)&__range1);
    }
    std::_Deque_iterator<CaseInfo,_CaseInfo_&,_CaseInfo_*>::operator++
              ((_Deque_iterator<CaseInfo,_CaseInfo_&,_CaseInfo_*> *)&__end1._M_node);
  }
  this->m_switchBuffer = (DataBuffer *)0x0;
  pDVar7 = currentBuffer(this);
  DataBuffer::writeHeader(pDVar7,CaseGoto);
  pDVar7 = currentBuffer(this);
  DataBuffer::writeDWord(pDVar7,(int)__range1);
  addSwitchCase(this,(DataBuffer *)0x0);
  iVar1 = (int)__range1;
  pSVar3 = List<ScopeInfo>::operator[](&this->m_scopeStack,this->m_scopeCursor);
  pSVar3->casecursor->number = iVar1;
  return;
}

Assistant:

void BotscriptParser::parseSwitchCase()
{
	// case is only allowed inside switch
	if (SCOPE (0).type != SCOPE_Switch)
		error ("case label outside switch");

	// Get a literal value for the case block. Zandronum does not support
	// expressions here.
	bool isNegative = m_lexer->next(Token::Minus);
	m_lexer->mustGetNext (Token::Number);
	int num = m_lexer->token()->text.toLong();
	if (isNegative) {
		num = -num;
	}
	m_lexer->mustGetNext (Token::Colon);

	for (const CaseInfo& info : SCOPE(0).cases)
	{
		if (info.number == num)
			error ("multiple case %1 labels in one switch", num);
	}

	// Write down the expression and case-go-to. This builds
	// the case tree. The closing event will write the actual
	// blocks and move the marks appropriately.
	//
	// AddSwitchCase will add the reference to the mark
	// for the case block that this heralds, and takes care
	// of buffering setup and stuff like that.
	//
	// We null the switch buffer for the case-go-to statement as
	// we want it all under the switch, not into the case-buffers.
	m_switchBuffer = nullptr;
	currentBuffer()->writeHeader (DataHeader::CaseGoto);
	currentBuffer()->writeDWord (num);
	addSwitchCase (null);
	SCOPE (0).casecursor->number = num;
}